

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_(*)(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&)>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_(*)(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&)>
           *this,_func_shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                 *f)

{
  _func_shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  *in_RDX;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  detail::
  build_param_type_list<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00459178;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }